

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

void __thiscall
clipp::parameter::parameter<char_const(&)[10]>(parameter *this,arg_string *str,char (*strs) [10])

{
  memento *in_RDX;
  parameter *in_RSI;
  function<clipp::subrange_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDI;
  match_predicate *in_stack_ffffffffffffff68;
  function<clipp::subrange_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__f;
  char (*in_stack_ffffffffffffffe0) [10];
  parameter *this_00;
  
  this_00 = in_RSI;
  detail::token<clipp::parameter>::token(&in_RSI->super_token<clipp::parameter>);
  detail::action_provider<clipp::parameter>::action_provider
            ((action_provider<clipp::parameter> *)in_RSI);
  __f = in_RDI + 5;
  *(undefined8 *)&in_RDI[5].super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&in_RDI[5].super__Function_base._M_functor + 8) = 0;
  in_RDI[5].super__Function_base._M_manager = (_Manager_type)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x181372);
  std::function<bool(std::__cxx11::string_const&)>::
  function<bool(&)(std::__cxx11::string_const&),void>
            ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_RDI,
             (_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)__f
            );
  predicate_adapter::predicate_adapter((predicate_adapter *)in_RSI,in_stack_ffffffffffffff68);
  std::function<clipp::subrange(std::__cxx11::string_const&)>::
  function<clipp::parameter::predicate_adapter,void>(in_RDI,(predicate_adapter *)__f);
  predicate_adapter::~predicate_adapter((predicate_adapter *)0x1813c4);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x1813ce);
  std::__cxx11::string::string((string *)&in_RDI[6]._M_invoker);
  *(undefined1 *)&in_RDI[7]._M_invoker = 0;
  *(undefined1 *)((long)&in_RDI[7]._M_invoker + 1) = 0;
  add_flags<std::__cxx11::string,char_const(&)[10]>(this_00,in_RDX,in_stack_ffffffffffffffe0);
  return;
}

Assistant:

explicit
    parameter(arg_string str, Strings&&... strs):
        flags_{},
        matcher_{predicate_adapter{match::none}},
        label_{}, required_{false}, greedy_{false}
    {
        add_flags(std::move(str), std::forward<Strings>(strs)...);
    }